

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O0

ConditionalStatementSyntax * __thiscall
slang::parsing::Parser::parseConditionalStatement
          (Parser *this,NamedLabelSyntax *label,AttrList attributes,Token uniqueOrPriority)

{
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements;
  string_view syntaxName;
  string_view syntaxName_00;
  Token uniqueOrPriority_00;
  Token prevToken;
  Token prevToken_00;
  Token ifKeyword_00;
  Token openParen_00;
  Token closeParen_00;
  StatementSyntax *attributes_00;
  NamedLabelSyntax *label_00;
  long lVar1;
  ConditionalStatementSyntax *pCVar2;
  Info *in_RSI;
  long in_RDI;
  ElseClauseSyntax *in_R8;
  Token TVar3;
  Token TVar4;
  Token *in_stack_00000038;
  TokenKind in_stack_00000046;
  ExpressionSyntax *in_stack_00000048;
  Parser *in_stack_00000050;
  ElseClauseSyntax *elseClause;
  StatementSyntax *statement;
  ConditionalPredicateSyntax *predicate;
  Token closeParen;
  Token openParen;
  Token ifKeyword;
  undefined1 in_stack_00000976;
  undefined1 in_stack_00000977;
  Parser *in_stack_00000978;
  size_t in_stack_fffffffffffffe38;
  Parser *in_stack_fffffffffffffe40;
  pointer in_stack_fffffffffffffe48;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffe50;
  SyntaxNode *in_stack_fffffffffffffe68;
  Parser *in_stack_fffffffffffffe70;
  SyntaxFactory *in_stack_fffffffffffffe78;
  char *in_stack_fffffffffffffe80;
  Parser *in_stack_fffffffffffffe88;
  Info *in_stack_fffffffffffffe90;
  StatementSyntax *pSVar5;
  TokenKind in_stack_fffffffffffffece;
  ParserBase *in_stack_fffffffffffffed0;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_50;
  
  TVar3 = ParserBase::expect(in_stack_fffffffffffffed0,in_stack_fffffffffffffece);
  TVar4 = ParserBase::expect(in_stack_fffffffffffffed0,in_stack_fffffffffffffece);
  Token::Token((Token *)in_stack_fffffffffffffe40);
  parseExpression(in_stack_fffffffffffffe40);
  parseConditionalPredicate(in_stack_00000050,in_stack_00000048,in_stack_00000046,in_stack_00000038)
  ;
  attributes_00 = parseStatement(in_stack_00000978,(bool)in_stack_00000977,(bool)in_stack_00000976);
  label_00 = (NamedLabelSyntax *)parseElseClause(in_stack_fffffffffffffe88);
  if (label_00 == (NamedLabelSyntax *)0x0) {
    pSVar5 = attributes_00;
    ::sv((char *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    prevToken_00.info = (Info *)pSVar5;
    prevToken_00._0_8_ = in_stack_fffffffffffffe88;
    syntaxName_00._M_str = in_stack_fffffffffffffe80;
    syntaxName_00._M_len = (size_t)in_stack_fffffffffffffe78;
    checkEmptyBody(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,prevToken_00,syntaxName_00);
  }
  else {
    not_null<slang::syntax::SyntaxNode_*>::operator*
              ((not_null<slang::syntax::SyntaxNode_*> *)0xc34bd6);
    ::sv((char *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    prevToken.info = in_stack_fffffffffffffe90;
    prevToken._0_8_ = in_stack_fffffffffffffe88;
    syntaxName._M_str = in_stack_fffffffffffffe80;
    syntaxName._M_len = (size_t)in_stack_fffffffffffffe78;
    checkEmptyBody(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,prevToken,syntaxName);
  }
  lVar1 = in_RDI + 0xe0;
  elements._M_extent._M_extent_value = in_stack_fffffffffffffe50._M_extent_value;
  elements._M_ptr = in_stack_fffffffffffffe48;
  slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
            ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_stack_fffffffffffffe40,
             elements);
  local_50 = (StatementSyntax *)TVar3.info;
  local_68 = TVar4._0_8_;
  local_60 = TVar4.info;
  uniqueOrPriority_00.info = in_RSI;
  uniqueOrPriority_00.kind = (short)lVar1;
  uniqueOrPriority_00._2_1_ = (char)((ulong)lVar1 >> 0x10);
  uniqueOrPriority_00.numFlags.raw = (char)((ulong)lVar1 >> 0x18);
  uniqueOrPriority_00.rawLen = (int)((ulong)lVar1 >> 0x20);
  ifKeyword_00.info = local_78;
  ifKeyword_00.kind = (short)in_RDI;
  ifKeyword_00._2_1_ = (char)((ulong)in_RDI >> 0x10);
  ifKeyword_00.numFlags.raw = (char)((ulong)in_RDI >> 0x18);
  ifKeyword_00.rawLen = (int)((ulong)in_RDI >> 0x20);
  openParen_00.info = local_68;
  openParen_00._0_8_ = local_70;
  closeParen_00.info._0_6_ = TVar3._0_6_;
  closeParen_00._0_8_ = local_60;
  closeParen_00.info._6_2_ = TVar3.rawLen._2_2_;
  pCVar2 = slang::syntax::SyntaxFactory::conditionalStatement
                     (in_stack_fffffffffffffe78,label_00,
                      (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)attributes_00,
                      uniqueOrPriority_00,ifKeyword_00,openParen_00,local_70,closeParen_00,local_50,
                      in_R8);
  return pCVar2;
}

Assistant:

ConditionalStatementSyntax& Parser::parseConditionalStatement(NamedLabelSyntax* label,
                                                              AttrList attributes,
                                                              Token uniqueOrPriority) {
    auto ifKeyword = expect(TokenKind::IfKeyword);
    auto openParen = expect(TokenKind::OpenParenthesis);

    Token closeParen;
    auto& predicate = parseConditionalPredicate(parseExpression(), TokenKind::CloseParenthesis,
                                                closeParen);
    auto& statement = parseStatement();
    auto elseClause = parseElseClause();

    if (elseClause)
        checkEmptyBody(*elseClause->clause, elseClause->elseKeyword, "else clause"sv);
    else
        checkEmptyBody(statement, closeParen, "if statement"sv);

    return factory.conditionalStatement(label, attributes, uniqueOrPriority, ifKeyword, openParen,
                                        predicate, closeParen, statement, elseClause);
}